

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_39db::TlbExportVisitor::visit_(TlbExportVisitor *this,Container *type)

{
  ostream *poVar1;
  ulong uVar2;
  TlbExportVisitor local_a8 [32];
  TlbExportVisitor local_88 [48];
  string local_58 [32];
  anon_unknown_dwarf_39db local_38 [32];
  Indirect *local_18;
  Container *type_local;
  TlbExportVisitor *this_local;
  
  local_18 = (Indirect *)type;
  type_local = (Container *)this;
  std::operator<<(this->m_stream,"<container ");
  indirect(this->m_stream,local_18);
  poVar1 = std::operator<<(this->m_stream," size=\"");
  uVar2 = Typelib::Type::getSize();
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  poVar1 = std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(poVar1," kind=\"");
  Typelib::Container::kind_abi_cxx11_();
  xmlEscape(local_38,local_58);
  poVar1 = std::operator<<(poVar1,(string *)local_38);
  poVar1 = std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(poVar1," ");
  (anonymous_namespace)::TlbExportVisitor::emitSourceID_abi_cxx11_(local_88);
  poVar1 = std::operator<<(poVar1,(string *)local_88);
  std::operator<<(poVar1,">\n");
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string((string *)local_58);
  poVar1 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  (anonymous_namespace)::TlbExportVisitor::emitMetaData_abi_cxx11_(local_a8,(Type *)this);
  poVar1 = std::operator<<(poVar1,(string *)local_a8);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)local_a8);
  poVar1 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  std::operator<<(poVar1,"</container>");
  return true;
}

Assistant:

bool TlbExportVisitor::visit_(Container const& type)
    {
        m_stream << "<container ";
        indirect(m_stream, type);
        m_stream
            << " size=\"" << type.getSize() << "\""
            << " kind=\"" << xmlEscape(type.kind()) << "\""
            << " " << emitSourceID() << ">\n";
        m_stream << m_indent << emitMetaData(type) << "\n";
        m_stream << m_indent << "</container>";
        return true;
    }